

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_chdir(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  char *__path;
  ulong uVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  
  __path = JS_ToCString(ctx,*argv);
  if (__path == (char *)0x0) {
    iVar4 = 6;
    JVar3.float64 = 0.0;
  }
  else {
    iVar1 = chdir(__path);
    uVar2 = js_get_errno((long)iVar1);
    JS_FreeCString(ctx,__path);
    JVar3.ptr = (void *)(uVar2 & 0xffffffff);
    iVar4 = 0;
  }
  JVar5.tag = iVar4;
  JVar5.u.ptr = JVar3.ptr;
  return JVar5;
}

Assistant:

static JSValue js_os_chdir(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *target;
    int err;

    target = JS_ToCString(ctx, argv[0]);
    if (!target)
        return JS_EXCEPTION;
    err = js_get_errno(chdir(target));
    JS_FreeCString(ctx, target);
    return JS_NewInt32(ctx, err);
}